

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O1

void __thiscall
pfd::internal::file_dialog::file_dialog
          (file_dialog *this,type in_type,string *title,string *default_path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filters,opt options)

{
  long lVar1;
  string *__x;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pbVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  undefined3 in_register_00000089;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  long lVar12;
  bool bVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  uint local_a4;
  string *local_a0;
  file_dialog *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = (string *)CONCAT44(local_a0._4_4_,in_type);
  settings::settings((settings *)this,false);
  (this->super_dialog).m_async.
  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001527f0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[2]._M_weak_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[3]._M_weak_count = 0;
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&p_Var2[1]._M_use_count = &p_Var2[2]._M_use_count;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var2[2]._M_use_count = 0;
  p_Var2[3]._M_use_count = -1;
  p_Var2[3]._M_weak_count = 0;
  *(undefined4 *)&p_Var2[4]._vptr__Sp_counted_base = 0xffffffff;
  (this->super_dialog).m_async.
  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
  ;
  (this->super_dialog).m_async.
  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  if (settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') {
    if (settings::flags(pfd::settings::flag)::flags._3_1_ == '\0') {
      if (settings::flags(pfd::settings::flag)::flags._4_1_ == '\0') {
        pcVar8 = "echo";
        if (settings::flags(pfd::settings::flag)::flags._5_1_ != '\0') {
          pcVar8 = "kdialog";
        }
      }
      else {
        pcVar8 = "qarma";
      }
    }
    else {
      pcVar8 = "matedialog";
    }
  }
  else {
    pcVar8 = "zenity";
  }
  paVar6 = &local_100.field_2;
  local_100._M_dataplus._M_p = (pointer)paVar6;
  local_98 = this;
  sVar3 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar8,pcVar8 + sVar3);
  __l._M_len = 1;
  __l._M_array = &local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l,(allocator_type *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar6) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (((settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
      (settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
     (settings::flags(pfd::settings::flag)::flags._4_1_ != '\x01')) {
    if (settings::flags(pfd::settings::flag)::flags._5_1_ != '\x01') goto LAB_0010b68a;
    if ((int)local_a0 == 0) {
      local_100._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--getopenfilename","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                 &local_100);
LAB_0010b806:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar6) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if ((int)local_a0 == 2) {
        local_100._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,"--getexistingdirectory","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                   &local_100);
        goto LAB_0010b806;
      }
      if ((int)local_a0 == 1) {
        local_100._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--getsavefilename","")
        ;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                   &local_100);
        goto LAB_0010b806;
      }
    }
    local_a0 = title;
    if ((options & multiselect) != none) {
      local_100._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," --multiple","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                 &local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar6) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e0,default_path);
    local_100._M_string_length = 0;
    local_100.field_2._M_allocated_capacity =
         local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pbVar7 = (filters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_100._M_dataplus._M_p = (pointer)paVar6;
    if (0x20 < (ulong)((long)(filters->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        pcVar8 = " | ";
        if (uVar11 == 0) {
          pcVar8 = "";
        }
        std::operator+(&local_50,pcVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar7->_M_dataplus)._M_p + lVar12));
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50,"(");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if (paVar6 == paVar5) {
          local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_90._M_dataplus._M_p = (pointer)paVar6;
        }
        local_90._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar7 = (filters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_90,*(char **)((long)&pbVar7[1]._M_dataplus._M_p + lVar12),
                           *(size_type *)((long)&pbVar7[1]._M_string_length + lVar12));
        local_70._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar6 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar6) {
          local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_70._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,")");
        local_c8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar6 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == paVar6) {
          local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_c8._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_100,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 1;
        pbVar7 = (filters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x40;
      } while (uVar11 < (ulong)((long)(filters->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >>
                               5) >> 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e0,&local_100);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--title","");
    __x = local_a0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e0,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0010b68a;
  }
  else {
    local_100._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--file-selection","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar6) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_100,"--filename=",default_path);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar6) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--title","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar6) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e0,title);
    local_100._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--separator=\n","");
    local_a4 = CONCAT31(in_register_00000089,options);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar6) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (0x20 < (ulong)((long)(filters->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(filters->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--file-filter","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                   &local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        pbVar7 = (filters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        lVar1 = *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar12);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,lVar1,
                   *(long *)((long)&pbVar7->_M_string_length + lVar12) + lVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_c8,"|");
        pbVar7 = (filters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_c8,*(char **)((long)&pbVar7[1]._M_dataplus._M_p + lVar12),
                           *(size_type *)((long)&pbVar7[1]._M_string_length + lVar12));
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if (paVar6 == paVar5) {
          local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_100._M_dataplus._M_p = (pointer)paVar6;
        }
        local_100._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                   &local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x40;
      } while (uVar11 < (ulong)((long)(filters->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(filters->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) >> 1);
    }
    uVar9 = local_a4;
    if ((int)local_a0 == 1) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--save","");
      uVar9 = local_a4;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                 &local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((int)local_a0 == 2) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--directory","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                 &local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    paVar6 = &local_100.field_2;
    if ((uVar9 & 2) == 0) {
      local_100._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--confirm-overwrite","")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                 &local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar6) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    if ((uVar9 & 1) == 0) goto LAB_0010b68a;
    local_100._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--multiple","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
               &local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar6) goto LAB_0010b68a;
  }
  operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
LAB_0010b68a:
  if (settings::flags(pfd::settings::flag)::flags._1_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"pfd: ",5);
    if (local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar10 = 0;
      pbVar7 = local_e0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar13 = iVar10 != 0;
        iVar10 = iVar10 + -1;
        pcVar8 = "\a";
        if (bVar13) {
          pcVar8 = ", ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,pcVar8 + 1,(ulong)bVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_e0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  executor::start_process
            ((local_98->super_dialog).m_async.
             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  return;
}

Assistant:

inline internal::file_dialog::file_dialog(type in_type,
            std::string const &title,
            std::string const &default_path /* = "" */,
            std::vector<std::string> const &filters /* = {} */,
            opt options /* = opt::none */)
{
#if _WIN32
    std::string filter_list;
    std::regex whitespace("  *");
    for (size_t i = 0; i + 1 < filters.size(); i += 2)
    {
        filter_list += filters[i] + '\0';
        filter_list += std::regex_replace(filters[i + 1], whitespace, ";") + '\0';
    }
    filter_list += '\0';

    m_async->start_func([this, in_type, title, default_path, filter_list,
                         options](int *exit_code) -> std::string
    {
        (void)exit_code;
        m_wtitle = internal::str2wstr(title);
        m_wdefault_path = internal::str2wstr(default_path);
        auto wfilter_list = internal::str2wstr(filter_list);

        // Folder selection uses a different method
        if (in_type == type::folder)
        {
            dll ole32("ole32.dll");

            auto status = dll::proc<HRESULT WINAPI (LPVOID, DWORD)>(ole32, "CoInitializeEx")
                              (nullptr, COINIT_APARTMENTTHREADED);
            if (flags(flag::is_vista))
            {
                // On Vista and higher we should be able to use IFileDialog for folder selection
                IFileDialog *ifd;
                HRESULT hr = dll::proc<HRESULT WINAPI (REFCLSID, LPUNKNOWN, DWORD, REFIID, LPVOID *)>(ole32, "CoCreateInstance")
                                 (CLSID_FileOpenDialog, nullptr, CLSCTX_INPROC_SERVER, IID_PPV_ARGS(&ifd));

                // In case CoCreateInstance fails (which it should not), try legacy approach
                if (SUCCEEDED(hr))
                    return select_folder_vista(ifd, options & opt::force_path);
            }

            BROWSEINFOW bi;
            memset(&bi, 0, sizeof(bi));

            bi.lpfn = &bffcallback;
            bi.lParam = (LPARAM)this;

            if (flags(flag::is_vista))
            {
                // This hangs on Windows XP, as reported here:
                // https://github.com/samhocevar/portable-file-dialogs/pull/21
                if (status == S_OK)
                    bi.ulFlags |= BIF_NEWDIALOGSTYLE;
                bi.ulFlags |= BIF_EDITBOX;
                bi.ulFlags |= BIF_STATUSTEXT;
            }

            auto *list = SHBrowseForFolderW(&bi);
            std::string ret;
            if (list)
            {
                auto buffer = new wchar_t[MAX_PATH];
                SHGetPathFromIDListW(list, buffer);
                dll::proc<void WINAPI (LPVOID)>(ole32, "CoTaskMemFree")(list);
                ret = internal::wstr2str(buffer);
                delete[] buffer;
            }
            if (status == S_OK)
                dll::proc<void WINAPI ()>(ole32, "CoUninitialize")();
            return ret;
        }

        OPENFILENAMEW ofn;
        memset(&ofn, 0, sizeof(ofn));
        ofn.lStructSize = sizeof(OPENFILENAMEW);
        ofn.hwndOwner = GetActiveWindow();

        ofn.lpstrFilter = wfilter_list.c_str();

        auto woutput = std::wstring(MAX_PATH * 256, L'\0');
        ofn.lpstrFile = (LPWSTR)woutput.data();
        ofn.nMaxFile = (DWORD)woutput.size();
        if (!m_wdefault_path.empty())
        {
            // If a directory was provided, use it as the initial directory. If
            // a valid path was provided, use it as the initial file. Otherwise,
            // let the Windows API decide.
            auto path_attr = GetFileAttributesW(m_wdefault_path.c_str());
            if (path_attr != INVALID_FILE_ATTRIBUTES && (path_attr & FILE_ATTRIBUTE_DIRECTORY))
                ofn.lpstrInitialDir = m_wdefault_path.c_str();
            else if (m_wdefault_path.size() <= woutput.size())
                //second argument is size of buffer, not length of string
                StringCchCopyW(ofn.lpstrFile, MAX_PATH*256+1, m_wdefault_path.c_str());
            else
            {
                ofn.lpstrFileTitle = (LPWSTR)m_wdefault_path.data();
                ofn.nMaxFileTitle = (DWORD)m_wdefault_path.size();
            }
        }
        ofn.lpstrTitle = m_wtitle.c_str();
        ofn.Flags = OFN_NOCHANGEDIR | OFN_EXPLORER;

        dll comdlg32("comdlg32.dll");

        if (in_type == type::save)
        {
            if (!(options & opt::force_overwrite))
                ofn.Flags |= OFN_OVERWRITEPROMPT;

            // using set context to apply new visual style (required for windows XP)
            new_style_context ctx;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_save_file_name(comdlg32, "GetSaveFileNameW");
            if (get_save_file_name(&ofn) == 0)
                return "";
            return internal::wstr2str(woutput.c_str());
        }

        if (options & opt::multiselect)
            ofn.Flags |= OFN_ALLOWMULTISELECT;
        ofn.Flags |= OFN_PATHMUSTEXIST;

        // using set context to apply new visual style (required for windows XP)
        new_style_context ctx;

        dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_open_file_name(comdlg32, "GetOpenFileNameW");
        if (get_open_file_name(&ofn) == 0)
            return "";

        std::string prefix;
        for (wchar_t const *p = woutput.c_str(); *p; )
        {
            auto filename = internal::wstr2str(p);
            p += wcslen(p);
            // In multiselect mode, we advance p one wchar further and
            // check for another filename. If there is one and the
            // prefix is empty, it means we just read the prefix.
            if ((options & opt::multiselect) && *++p && prefix.empty())
            {
                prefix = filename + "/";
                continue;
            }

            m_vector_result.push_back(prefix + filename);
        }

        return "";
    });
#else
    auto command = desktop_helper();

    if (is_osascript())
    {
        std::string script = "set ret to choose";
        switch (in_type)
        {
            case type::save:
                script += " file name";
                break;
            case type::open: default:
                script += " file";
                if (options & opt::multiselect)
                    script += " with multiple selections allowed";
                break;
            case type::folder:
                script += " folder";
                break;
        }

        if (default_path.size())
            script += " default location " + osascript_quote(default_path);
        script += " with prompt " + osascript_quote(title);

        if (in_type == type::open)
        {
            // Concatenate all user-provided filter patterns
            std::string patterns;
            for (size_t i = 0; i < filters.size() / 2; ++i)
                patterns += " " + filters[2 * i + 1];

            // Split the pattern list to check whether "*" is in there; if it
            // is, we have to disable filters because there is no mechanism in
            // OS X for the user to override the filter.
            std::regex sep("\\s+");
            std::string filter_list;
            bool has_filter = true;
            std::sregex_token_iterator iter(patterns.begin(), patterns.end(), sep, -1);
            std::sregex_token_iterator end;
            for ( ; iter != end; ++iter)
            {
                auto pat = iter->str();
                if (pat == "*" || pat == "*.*")
                    has_filter = false;
                else if (internal::starts_with(pat, "*."))
                    filter_list += (filter_list.size() == 0 ? "" : ",") +
                                   osascript_quote(pat.substr(2, pat.size() - 2));
            }
            if (has_filter && filter_list.size() > 0)
                script += " of type {" + filter_list + "}";
        }

        if (in_type == type::open && (options & opt::multiselect))
        {
            script += "\nset s to \"\"";
            script += "\nrepeat with i in ret";
            script += "\n  set s to s & (POSIX path of i) & \"\\n\"";
            script += "\nend repeat";
            script += "\ncopy s to stdout";
        }
        else
        {
            script += "\nPOSIX path of ret";
        }

        command.push_back("-e");
        command.push_back(script);
    }
    else if (is_zenity())
    {
        command.push_back("--file-selection");
        command.push_back("--filename=" + default_path);
        command.push_back("--title");
        command.push_back(title);
        command.push_back("--separator=\n");

        for (size_t i = 0; i < filters.size() / 2; ++i)
        {
            command.push_back("--file-filter");
            command.push_back(filters[2 * i] + "|" + filters[2 * i + 1]);
        }

        if (in_type == type::save)
            command.push_back("--save");
        if (in_type == type::folder)
            command.push_back("--directory");
        if (!(options & opt::force_overwrite))
            command.push_back("--confirm-overwrite");
        if (options & opt::multiselect)
            command.push_back("--multiple");
    }
    else if (is_kdialog())
    {
        switch (in_type)
        {
            case type::save: command.push_back("--getsavefilename"); break;
            case type::open: command.push_back("--getopenfilename"); break;
            case type::folder: command.push_back("--getexistingdirectory"); break;
        }
        if (options & opt::multiselect)
            command.push_back(" --multiple");

        command.push_back(default_path);

        std::string filter;
        for (size_t i = 0; i < filters.size() / 2; ++i)
            filter += (i == 0 ? "" : " | ") + filters[2 * i] + "(" + filters[2 * i + 1] + ")";
        command.push_back(filter);

        command.push_back("--title");
        command.push_back(title);
    }

    if (flags(flag::is_verbose))
        std::cerr << "pfd: " << command << std::endl;

    m_async->start_process(command);
#endif
}